

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O1

void duckdb::WriteDataToVarcharSegment
               (ListSegmentFunctions *functions,ArenaAllocator *allocator,ListSegment *segment,
               RecursiveUnifiedVectorFormat *input_data,idx_t *entry_idx)

{
  idx_t *piVar1;
  long *plVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  long lVar6;
  const_reference functions_00;
  ListSegment *pLVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  LinkedList child_segments;
  LinkedList local_68;
  ListSegment *local_48;
  ListSegment *local_40;
  data_ptr_t local_38;
  
  uVar5 = *entry_idx;
  psVar3 = ((input_data->unified).sel)->sel_vector;
  if (psVar3 != (sel_t *)0x0) {
    uVar5 = (ulong)psVar3[uVar5];
  }
  local_48 = segment + 1;
  puVar4 = (input_data->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (puVar4 == (unsigned_long *)0x0) {
    bVar10 = true;
  }
  else {
    bVar10 = (puVar4[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0;
  }
  uVar8 = (ulong)segment->count;
  *(byte *)((long)&segment[1].count + uVar8) = bVar10 ^ 1;
  uVar9 = (ulong)segment->capacity;
  if (bVar10 == false) {
    *(undefined8 *)((long)&local_48->count + uVar8 * 8 + uVar9) = 0;
  }
  else {
    local_38 = (input_data->unified).data;
    lVar6 = uVar5 * 0x10;
    uVar5 = (ulong)*(uint *)(local_38 + lVar6);
    if (uVar5 < 0xd) {
      local_38 = local_38 + lVar6 + 4;
    }
    else {
      local_38 = *(data_ptr_t *)(local_38 + lVar6 + 8);
    }
    *(ulong *)((long)&local_48->count + uVar8 * 8 + uVar9) = uVar5;
    local_68.last_segment = *(ListSegment **)((long)&segment[2].count + uVar9 * 9);
    piVar1 = (idx_t *)((long)&local_48->count + uVar9 * 9);
    local_68.total_capacity = *piVar1;
    local_68.first_segment = (ListSegment *)piVar1[1];
    local_40 = segment;
    if (uVar5 != 0) {
      uVar9 = 0;
      do {
        functions_00 = vector<duckdb::ListSegmentFunctions,_true>::back(&functions->child_functions)
        ;
        pLVar7 = GetSegment(functions_00,allocator,&local_68);
        uVar8 = (ulong)pLVar7->capacity - (ulong)pLVar7->count;
        if (uVar5 - uVar9 < uVar8) {
          uVar8 = uVar5 - uVar9;
        }
        switchD_012e1ce8::default
                  ((void *)((long)&pLVar7[1].count + (ulong)pLVar7->count),local_38 + uVar9,uVar8);
        uVar9 = uVar9 + uVar8;
        pLVar7->count = pLVar7->count + (short)uVar8;
      } while (uVar9 < uVar5);
    }
    lVar6 = (ulong)local_40->capacity * 9;
    *(ListSegment **)((long)&local_48[1].count + lVar6) = local_68.last_segment;
    plVar2 = (long *)((long)&local_48->count + lVar6);
    *plVar2 = local_68.total_capacity + uVar5;
    plVar2[1] = (long)local_68.first_segment;
  }
  return;
}

Assistant:

static void WriteDataToVarcharSegment(const ListSegmentFunctions &functions, ArenaAllocator &allocator,
                                      ListSegment *segment, RecursiveUnifiedVectorFormat &input_data,
                                      idx_t &entry_idx) {

	auto sel_entry_idx = input_data.unified.sel->get_index(entry_idx);

	// write null validity
	auto null_mask = GetNullMask(segment);
	auto valid = input_data.unified.validity.RowIsValid(sel_entry_idx);
	null_mask[segment->count] = !valid;

	// set the length of this string
	auto str_length_data = GetListLengthData(segment);

	// we can reconstruct the offset from the length
	if (!valid) {
		Store<uint64_t>(0, data_ptr_cast(str_length_data + segment->count));
		return;
	}
	auto &str_entry = UnifiedVectorFormat::GetData<string_t>(input_data.unified)[sel_entry_idx];
	auto str_data = str_entry.GetData();
	idx_t str_size = str_entry.GetSize();
	Store<uint64_t>(str_size, data_ptr_cast(str_length_data + segment->count));

	// write the characters to the linked list of child segments
	auto child_segments = Load<LinkedList>(data_ptr_cast(GetListChildData(segment)));
	idx_t current_offset = 0;
	while (current_offset < str_size) {
		auto child_segment = GetSegment(functions.child_functions.back(), allocator, child_segments);
		auto data = GetStringData(child_segment);
		idx_t copy_count = MinValue<idx_t>(str_size - current_offset, child_segment->capacity - child_segment->count);
		memcpy(data + child_segment->count, str_data + current_offset, copy_count);
		current_offset += copy_count;
		child_segment->count += copy_count;
	}
	child_segments.total_capacity += str_size;
	// store the updated linked list
	Store<LinkedList>(child_segments, data_ptr_cast(GetListChildData(segment)));
}